

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSizeTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::Texture2DSizeCase::Texture2DSizeCase
          (Texture2DSizeCase *this,TestContext *testCtx,RenderContext *renderCtx,char *name,
          char *description,deUint32 format,deUint32 dataType,int width,int height,bool mipmaps)

{
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name,description);
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__Texture2DSizeCase_01e13c70;
  this->m_renderCtx = renderCtx;
  this->m_format = format;
  this->m_dataType = dataType;
  this->m_width = width;
  this->m_height = height;
  this->m_useMipmaps = mipmaps;
  this->m_texture = (Texture2D *)0x0;
  deqp::gls::TextureTestUtil::TextureRenderer::TextureRenderer
            (&this->m_renderer,renderCtx,testCtx->m_log,GLSL_VERSION_100_ES,PRECISION_MEDIUMP);
  return;
}

Assistant:

Texture2DSizeCase::Texture2DSizeCase (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const char* name, const char* description, deUint32 format, deUint32 dataType, int width, int height, bool mipmaps)
	: TestCase		(testCtx, name, description)
	, m_renderCtx	(renderCtx)
	, m_format		(format)
	, m_dataType	(dataType)
	, m_width		(width)
	, m_height		(height)
	, m_useMipmaps	(mipmaps)
	, m_texture		(DE_NULL)
	, m_renderer	(renderCtx, testCtx.getLog(), glu::GLSL_VERSION_100_ES, glu::PRECISION_MEDIUMP)
{
}